

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O3

void __thiscall find_ctx::add_result(find_ctx *this,vm_obj_id_t obj,vm_val_t *match_result)

{
  vm_val_t *pvVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  undefined4 uVar5;
  find_entry_page *pfVar6;
  long lVar7;
  find_entry_page *pfVar8;
  
  lVar7 = (long)this->result_free;
  if (lVar7 == 0x20) {
    pfVar6 = (find_entry_page *)malloc(0x308);
    pfVar6->nxt = (find_entry_page *)0x0;
    pfVar8 = this->results_tail;
    if (this->results_tail == (find_entry_page *)0x0) {
      pfVar8 = (find_entry_page *)this;
    }
    pfVar8->nxt = pfVar6;
    this->results_tail = pfVar6;
    this->result_free = 0;
    lVar7 = 0;
  }
  else {
    pfVar6 = this->results_tail;
  }
  pfVar6->entry[lVar7].obj = obj;
  uVar5 = *(undefined4 *)&match_result->field_0x4;
  aVar4 = match_result->val;
  pvVar1 = &this->results_tail->entry[this->result_free].match_result;
  pvVar1->typ = match_result->typ;
  *(undefined4 *)&pvVar1->field_0x4 = uVar5;
  pvVar1->val = aVar4;
  uVar2 = this->result_free;
  uVar3 = this->result_cnt;
  this->result_free = uVar2 + 1;
  this->result_cnt = uVar3 + 1;
  return;
}

Assistant:

void add_result(vm_obj_id_t obj, const vm_val_t *match_result)
    {
        /* 
         *   if we have no pages, or we're out of room on the current page,
         *   allocate a new page 
         */
        if (result_free == FIND_ENTRIES_PER_PAGE)
        {
            find_entry_page *pg;
            
            /* allocate a new page */
            pg = (find_entry_page *)t3malloc(sizeof(find_entry_page));
            
            /* link it in at the end of the list */
            pg->nxt = 0;
            if (results_tail != 0)
                results_tail->nxt = pg;
            else
                results_head = pg;
            results_tail = pg;

            /* reset the free pointer to the start of the new page */
            result_free = 0;
        }

        /* add this result */
        results_tail->entry[result_free].obj = obj;
        results_tail->entry[result_free].match_result = *match_result;
        ++result_free;
        ++result_cnt;
    }